

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_3::DBIter::DBIter
          (DBIter *this,DBImpl *db,Comparator *cmp,Iterator *iter,SequenceNumber s,uint32_t seed)

{
  long lVar1;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  DBIter *in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff84;
  Random *in_stack_ffffffffffffff88;
  size_t *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Iterator::Iterator(&in_stack_ffffffffffffff78->super_Iterator);
  *in_RDI = &PTR__DBIter_023cabb8;
  in_RDI[5] = in_RSI;
  in_RDI[6] = in_RDX;
  in_RDI[7] = in_RCX;
  in_RDI[8] = in_R8;
  Status::Status((Status *)in_stack_ffffffffffffff78);
  std::__cxx11::string::string(in_stack_ffffffffffffff90);
  std::__cxx11::string::string(in_stack_ffffffffffffff90);
  *(undefined4 *)(in_RDI + 0x12) = 0;
  *(undefined1 *)((long)in_RDI + 0x94) = 0;
  Random::Random(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  psVar3 = in_RDI + 0x14;
  sVar2 = RandomCompactionPeriod(in_stack_ffffffffffffff78);
  *psVar3 = sVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DBIter(DBImpl* db, const Comparator* cmp, Iterator* iter, SequenceNumber s,
         uint32_t seed)
      : db_(db),
        user_comparator_(cmp),
        iter_(iter),
        sequence_(s),
        direction_(kForward),
        valid_(false),
        rnd_(seed),
        bytes_until_read_sampling_(RandomCompactionPeriod()) {}